

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O2

int evutil_ascii_strcasecmp(char *s1,char *s2)

{
  byte *pbVar1;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    pbVar1 = (byte *)(s1 + lVar2);
    if ((char)""[*pbVar1] < (char)""[(byte)s2[lVar2]]) {
      return -1;
    }
    if ((char)""[(byte)s2[lVar2]] < (char)""[*pbVar1]) break;
    lVar2 = lVar2 + 1;
    if (*pbVar1 == 0) {
      return 0;
    }
  }
  return 1;
}

Assistant:

int
evutil_ascii_strcasecmp(const char *s1, const char *s2)
{
	char c1, c2;
	while (1) {
		c1 = EVUTIL_TOLOWER_(*s1++);
		c2 = EVUTIL_TOLOWER_(*s2++);
		if (c1 < c2)
			return -1;
		else if (c1 > c2)
			return 1;
		else if (c1 == 0)
			return 0;
	}
}